

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptIntrinsics.cpp
# Opt level: O0

IntrinsicResult __thiscall
MiniScript::intrinsic_char(MiniScript *this,Context *context,IntrinsicResult *partialResult)

{
  int32_t iVar1;
  Value local_88;
  undefined1 local_78 [8];
  String s;
  long len;
  char buf [5];
  String local_48;
  undefined1 local_38 [24];
  long codePoint;
  IntrinsicResult *partialResult_local;
  Context *context_local;
  
  codePoint = (long)partialResult;
  partialResult_local = (IntrinsicResult *)context;
  context_local = (Context *)this;
  String::String(&local_48,"codePoint");
  Context::GetVar((Context *)local_38,(String *)context,(LocalOnlyMode)&local_48);
  iVar1 = Value::IntValue((Value *)local_38);
  Value::~Value((Value *)local_38);
  String::~String(&local_48);
  local_38._16_8_ = (long)iVar1;
  s._8_8_ = UTF8Encode((long)iVar1,(uchar *)((long)&len + 7));
  String::String((String *)local_78,(char *)((long)&len + 7),s._8_8_);
  Value::Value(&local_88,(String *)local_78);
  IntrinsicResult::IntrinsicResult((IntrinsicResult *)this,&local_88,true);
  Value::~Value(&local_88);
  String::~String((String *)local_78);
  return (IntrinsicResult)(IntrinsicResultStorage *)this;
}

Assistant:

static IntrinsicResult intrinsic_char(Context *context, IntrinsicResult partialResult) {
		long codePoint = context->GetVar("codePoint").IntValue();
		char buf[5];
		long len = UTF8Encode((unsigned long)codePoint, (unsigned char*)buf);
		String s(buf, (size_t)len);
		return IntrinsicResult(s);
	}